

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shlut.hpp
# Opt level: O0

void calculate_sh_lut(float *data,int size)

{
  float px;
  float pz;
  float pz_00;
  vec3f vVar1;
  int local_42c;
  data_t dStack_428;
  int index;
  data_t local_420;
  undefined1 local_414 [8];
  vec3f N;
  float coeffs [225];
  int local_7c;
  undefined1 local_78 [4];
  int face;
  vec3f d [6];
  float v;
  float u;
  float GU;
  int j;
  int i;
  int size_local;
  float *data_local;
  
  for (GU = 0.0; (int)GU < size; GU = (float)((int)GU + 1)) {
    for (u = 0.0; (int)u < size; u = (float)((int)u + 1)) {
      px = (float)size * 0.5;
      pz = ((float)(int)u - px) + 0.5;
      pz_00 = ((float)(int)GU - px) + 0.5;
      vec3f::vec3f((vec3f *)local_78,px,-pz_00,-pz);
      vec3f::vec3f((vec3f *)&d[0].y,-px,-pz_00,pz);
      vec3f::vec3f((vec3f *)&d[1].y,pz,px,pz_00);
      vec3f::vec3f((vec3f *)&d[2].y,pz,-px,-pz_00);
      vec3f::vec3f((vec3f *)&d[3].y,pz,-pz_00,px);
      vec3f::vec3f((vec3f *)&d[4].y,-pz,-pz_00,-px);
      for (local_7c = 0; local_7c < 6; local_7c = local_7c + 1) {
        vVar1 = normalized((vec3f *)(local_78 + (long)local_7c * 0xc));
        _dStack_428 = vVar1._0_8_;
        local_414._0_4_ = dStack_428;
        local_414._4_4_ = index;
        local_420 = vVar1.z;
        N.x = local_420;
        SHEvaluate((vec3f *)local_414,0xe,&N.y);
        for (local_42c = 0; local_42c < 0xe1; local_42c = local_42c + 1) {
          data[((local_42c * 6 + local_7c) * size + (int)GU) * size + (int)u] =
               coeffs[(long)local_42c + -2];
        }
      }
    }
  }
  return;
}

Assistant:

void calculate_sh_lut(float* data, const int size)
// layout: SHindex, face, position, rgb
{
	// evaluate SH bases at different direction N
	for (int i = 0; i < size; i++)
	{
		for (int j = 0; j < size; j++)
		{
			float GU = size*0.5f;
			float u = (float)j - GU + 0.5f;
			float v = (float)i - GU + 0.5f;
			// corresponding direction on each face
			vec3f d[6] = {
				vec3f( GU,  -v,  -u),
				vec3f(-GU,  -v,   u),
				vec3f(  u,  GU,   v),
				vec3f(  u, -GU,  -v),
				vec3f(  u,  -v,  GU),
				vec3f( -u,  -v, -GU)
			};
			for (int face = 0; face < 6; face++)
			{
				float coeffs[N_COEFFS];
				vec3f N = normalized(d[face]);
				SHEvaluate(N, shorder-1, coeffs);
				// fill in data
				for(int index=0; index < N_COEFFS; ++index) {
					data[((index*6 + face) * size + i) * size + j] = coeffs[index];
				}
			}
		}
	}
}